

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteConstant<unsigned_char,unsigned_char,unsigned_char,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseOROperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  unsigned_long *puVar1;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if (((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) &&
     ((puVar1 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar1 == (unsigned_long *)0x0 || ((*puVar1 & 1) != 0)))) {
    *result->data = *right->data | *left->data;
    return;
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}